

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O1

LR des_inner_cipher(LR lr,des_keysched *sched,size_t start,size_t step)

{
  size_t sVar1;
  LR LVar2;
  
  LVar2 = des_round(lr,sched,start);
  LVar2 = des_round(LVar2,sched,step + start);
  LVar2 = des_round(LVar2,sched,start + step * 2);
  LVar2 = des_round(LVar2,sched,start + step * 3);
  LVar2 = des_round(LVar2,sched,start + step * 4);
  LVar2 = des_round(LVar2,sched,start + step * 5);
  LVar2 = des_round(LVar2,sched,start + step * 6);
  LVar2 = des_round(LVar2,sched,step * 7 + start);
  LVar2 = des_round(LVar2,sched,start + step * 8);
  LVar2 = des_round(LVar2,sched,step * 9 + start);
  sVar1 = start + step * 10;
  LVar2 = des_round(LVar2,sched,sVar1);
  LVar2 = des_round(LVar2,sched,sVar1 + step);
  sVar1 = start + step * 0xc;
  LVar2 = des_round(LVar2,sched,sVar1);
  LVar2 = des_round(LVar2,sched,sVar1 + step);
  LVar2 = des_round(LVar2,sched,step * 0xe + start);
  LVar2 = des_round(LVar2,sched,step * 0xf + start);
  return (LR)((long)LVar2 << 0x20 | (ulong)LVar2 >> 0x20);
}

Assistant:

static inline LR des_inner_cipher(LR lr, const des_keysched *sched,
                                  size_t start, size_t step)
{
    lr = des_round(lr, sched, start+0x0*step);
    lr = des_round(lr, sched, start+0x1*step);
    lr = des_round(lr, sched, start+0x2*step);
    lr = des_round(lr, sched, start+0x3*step);
    lr = des_round(lr, sched, start+0x4*step);
    lr = des_round(lr, sched, start+0x5*step);
    lr = des_round(lr, sched, start+0x6*step);
    lr = des_round(lr, sched, start+0x7*step);
    lr = des_round(lr, sched, start+0x8*step);
    lr = des_round(lr, sched, start+0x9*step);
    lr = des_round(lr, sched, start+0xa*step);
    lr = des_round(lr, sched, start+0xb*step);
    lr = des_round(lr, sched, start+0xc*step);
    lr = des_round(lr, sched, start+0xd*step);
    lr = des_round(lr, sched, start+0xe*step);
    lr = des_round(lr, sched, start+0xf*step);
    return des_swap_lr(lr);
}